

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

void count(void)

{
  Configuration *pCVar1;
  int iVar2;
  string local_1f0;
  string local_1d0;
  LLogMessage local_1b0;
  
  iVar2 = 0;
  do {
    pCVar1 = ins::Configuration::GetInstance();
    if ((int)pCVar1->log_level_ < 2) {
      local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_1d0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jerett[P]llog/main.cpp","")
      ;
      local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f0,"count","");
      ins::LLogMessage::LLogMessage(&local_1b0,&local_1d0,&local_1f0,0x13,1);
      std::ostream::operator<<((ostream *)&local_1b0,iVar2);
      ins::LLogMessage::~LLogMessage(&local_1b0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
        operator_delete(local_1f0._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
        operator_delete(local_1d0._M_dataplus._M_p);
      }
    }
    iVar2 = iVar2 + 1;
  } while (iVar2 != 99);
  return;
}

Assistant:

void count() {
  for (int i = 0 ; i < 99; ++i) {
    LOG(INFO) << i;
//    CHECK(i < 90) << " meet 90 first i:" << i;
  }
}